

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

APInt __thiscall llvm::detail::IEEEFloat::convertQuadrupleAPFloatToAPInt(IEEEFloat *this)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  long *in_RSI;
  ulong uVar4;
  ArrayRef<unsigned_long> bigVal;
  APInt AVar5;
  uint64_t words [2];
  undefined8 extraout_RDX;
  
  if ((undefined1 *)*in_RSI != semIEEEquad) {
    __assert_fail("semantics == (const llvm::fltSemantics*)&semIEEEquad",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb3f,"APInt llvm::detail::IEEEFloat::convertQuadrupleAPFloatToAPInt() const");
  }
  bVar1 = *(byte *)((long)in_RSI + 0x12);
  bVar2 = bVar1 & 7;
  if (bVar2 == 3 || (bVar1 & 6) == 0) {
    if (bVar2 == 3) {
      uVar3 = 0;
    }
    else {
      if (bVar2 == 1) {
        words[0] = *(uint64_t *)in_RSI[1];
        uVar4 = ((uint64_t *)in_RSI[1])[1];
        uVar3 = 0x7fff;
        goto LAB_00193954;
      }
      if ((bVar1 & 7) != 0) {
        __assert_fail("category == fcNaN && \"Unknown category!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xb51,"APInt llvm::detail::IEEEFloat::convertQuadrupleAPFloatToAPInt() const"
                     );
      }
      uVar3 = 0x7fff;
    }
    words[0] = 0;
    uVar4 = 0;
  }
  else {
    uVar3 = (long)(short)in_RSI[2] + 0x3fff;
    words[0] = *(uint64_t *)in_RSI[1];
    uVar4 = ((uint64_t *)in_RSI[1])[1];
    if (uVar3 == 1) {
      uVar3 = (ulong)((ushort)(uVar4 >> 0x30) & 1);
    }
  }
LAB_00193954:
  words[1] = uVar4 & 0xffffffffffff |
             (ulong)((uint)uVar3 & 0x7fff) << 0x30 | (ulong)(bVar1 >> 3) << 0x3f;
  bigVal.Length = 2;
  bigVal.Data = words;
  APInt::APInt((APInt *)this,0x80,bigVal);
  AVar5._8_8_ = extraout_RDX;
  AVar5.U.pVal = (uint64_t *)this;
  return AVar5;
}

Assistant:

APInt IEEEFloat::convertQuadrupleAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics*)&semIEEEquad);
  assert(partCount()==2);

  uint64_t myexponent, mysignificand, mysignificand2;

  if (isFiniteNonZero()) {
    myexponent = exponent+16383; //bias
    mysignificand = significandParts()[0];
    mysignificand2 = significandParts()[1];
    if (myexponent==1 && !(mysignificand2 & 0x1000000000000LL))
      myexponent = 0;   // denormal
  } else if (category==fcZero) {
    myexponent = 0;
    mysignificand = mysignificand2 = 0;
  } else if (category==fcInfinity) {
    myexponent = 0x7fff;
    mysignificand = mysignificand2 = 0;
  } else {
    assert(category == fcNaN && "Unknown category!");
    myexponent = 0x7fff;
    mysignificand = significandParts()[0];
    mysignificand2 = significandParts()[1];
  }

  uint64_t words[2];
  words[0] = mysignificand;
  words[1] = ((uint64_t)(sign & 1) << 63) |
             ((myexponent & 0x7fff) << 48) |
             (mysignificand2 & 0xffffffffffffLL);

  return APInt(128, words);
}